

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

void * monitoring_thread_loop(void *arg)

{
  int iVar1;
  long lVar2;
  pthread_t __th;
  int __not_first_call;
  void *__cancel_arg;
  _func_void_void_ptr *__cancel_routine;
  __pthread_unwind_buf_t __cancel_buf;
  sigset_t monitoring_sig_set;
  int i;
  siginfo_t info;
  int res;
  code *arg_00;
  __pthread_unwind_buf_t local_188;
  sigset_t local_120;
  int local_9c;
  siginfo_t local_98;
  int local_14;
  
  local_14 = 0;
  prctl(0xf,"libkqueue_mon",0,0);
  nb_max_fd = get_fd_limit();
  sigemptyset(&local_120);
  sigfillset(&local_120);
  pthread_sigmask(0,&local_120,(__sigset_t *)0x0);
  sigemptyset(&local_120);
  iVar1 = __libc_current_sigrtmin();
  sigaddset(&local_120,iVar1 + 1);
  lVar2 = syscall(0xba);
  monitoring_tid = (pid_t)lVar2;
  fd_map = (int *)calloc((long)nb_max_fd,4);
  if (fd_map != (int *)0x0) {
    for (local_9c = 0; local_9c < nb_max_fd; local_9c = local_9c + 1) {
      fd_map[local_9c] = -1;
    }
    fd_use_cnt = (uint *)calloc((long)nb_max_fd,4);
    if (fd_use_cnt == (uint *)0x0) {
      free(fd_map);
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)&monitoring_thread_mtx);
      pthread_cond_signal((pthread_cond_t *)&monitoring_thread_cond);
      pthread_mutex_unlock((pthread_mutex_t *)&monitoring_thread_mtx);
      monitoring_thread_state = THREAD_EXIT_STATE_CANCEL_UNLOCKED;
      arg_00 = monitoring_thread_cleanup;
      iVar1 = __sigsetjmp(&local_188,0);
      if (iVar1 != 0) {
        monitoring_thread_cleanup(arg_00);
        __pthread_unwind_next(&local_188);
      }
      __pthread_register_cancel(&local_188);
      while( true ) {
        do {
          local_14 = sigwaitinfo(&local_120,&local_98);
        } while (local_14 == -1);
        pthread_setcancelstate(1,(int *)0x0);
        pthread_mutex_lock((pthread_mutex_t *)&kq_mtx);
        monitoring_thread_kqueue_cleanup(iVar1);
        if (kq_cnt == 0) break;
        pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
        pthread_setcancelstate(0,(int *)0x0);
      }
      monitoring_thread_state = THREAD_EXIT_STATE_CANCEL_LOCKED;
      pthread_setcancelstate(0,(int *)0x0);
      pthread_testcancel();
      monitoring_thread_state = THREAD_EXIT_STATE_SELF_CANCEL;
      __pthread_unregister_cancel(&local_188);
      monitoring_thread_cleanup(arg_00);
      __th = pthread_self();
      local_14 = pthread_detach(__th);
      pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
    }
  }
  return (void *)0x0;
}

Assistant:

static void *
monitoring_thread_loop(UNUSED void *arg)
{
    int res = 0;
    siginfo_t info;

    int i;

    sigset_t monitoring_sig_set;

    /* Set the thread's name to something descriptive so it shows up in gdb,
     * etc. glibc >= 2.1.2 supports pthread_setname_np, but this is a safer way
     * to do it for backwards compatibility. Max name length is 16 bytes. */
    prctl(PR_SET_NAME, "libkqueue_mon", 0, 0, 0);

    nb_max_fd = get_fd_limit();

    sigemptyset(&monitoring_sig_set);
    sigfillset(&monitoring_sig_set);

    pthread_sigmask(SIG_BLOCK, &monitoring_sig_set, NULL);

    sigemptyset(&monitoring_sig_set);
    sigaddset(&monitoring_sig_set, MONITORING_THREAD_SIGNAL);

    monitoring_tid = syscall(SYS_gettid);

    dbg_printf("tid=%u - monitoring thread started", monitoring_tid);

    fd_map = calloc(nb_max_fd, sizeof(int));
    if (fd_map == NULL) {
    error:
        return NULL;
    }
    for (i = 0; i < nb_max_fd; i++)
        fd_map[i] = -1;

    fd_use_cnt = calloc(nb_max_fd, sizeof(unsigned int));
    if (fd_use_cnt == NULL){
        free(fd_map);
        goto error;
    }

    /*
     * Now that thread is initialized, let kqueue init resume
     */
    pthread_mutex_lock(&monitoring_thread_mtx);    /* Must try to lock to ensure parent is waiting on signal */
    pthread_cond_signal(&monitoring_thread_cond);
    pthread_mutex_unlock(&monitoring_thread_mtx);

    monitoring_thread_state = THREAD_EXIT_STATE_CANCEL_UNLOCKED;
    pthread_cleanup_push(monitoring_thread_cleanup, NULL)
    while (true) {
        /*
         * Wait for signal notifying us that a change has occured on the pipe
         * It's not possible to only listen on FD close but no other operation
         * should be performed on the kqueue.
         */
        res = sigwaitinfo(&monitoring_sig_set, &info);
        if (res == -1) {
            dbg_printf("sigwaitinfo(2): %s", strerror(errno));
            continue;
        }

        /*
         * Don't allow cancellation in the middle of cleaning up resources
         */
        pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
        tracing_mutex_lock(&kq_mtx);
        dbg_printf("fd=%i - freeing kqueue due to fd closure (signal) for sfd=%i ", fd_map[info.si_fd], info.si_fd);

        /*
         * Release resources used by this kqueue
         */
        monitoring_thread_kqueue_cleanup(info.si_fd);

        /*
         * Exit if there are no more kqueues to monitor
         */
        if (kq_cnt == 0)
            break;

        tracing_mutex_unlock(&kq_mtx);
        pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
    }

    /*
     * Ensure that any cancellation requests are acted on
     */
    monitoring_thread_state = THREAD_EXIT_STATE_CANCEL_LOCKED;
    pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
    pthread_testcancel();

    monitoring_thread_state = THREAD_EXIT_STATE_SELF_CANCEL;
    pthread_cleanup_pop(true); /* Executes the cleanup function (monitoring_thread_cleanup) */
    res = pthread_detach(pthread_self());
    if (res != 0)
        dbg_printf("pthread_detach(3): %s", strerror(res));
    tracing_mutex_unlock(&kq_mtx);

    return NULL;
}